

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep_io.c
# Opt level: O2

int LSRKStepGetNumDomEigUpdates(void *arkode_mem,long *dom_eig_num_evals)

{
  int iVar1;
  ARKodeLSRKStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = lsrkStep_AccessARKODEStepMem(arkode_mem,"LSRKStepGetNumDomEigUpdates",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    if (dom_eig_num_evals == (long *)0x0) {
      iVar1 = -0x16;
      arkProcessError(ark_mem,-0x16,0x1c2,"LSRKStepGetNumDomEigUpdates",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep_io.c"
                      ,"dom_eig_num_evals cannot be NULL");
    }
    else {
      *dom_eig_num_evals = step_mem->dom_eig_num_evals;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int LSRKStepGetNumDomEigUpdates(void* arkode_mem, long int* dom_eig_num_evals)
{
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeLSRKStepMem structures */
  retval = lsrkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  if (dom_eig_num_evals == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "dom_eig_num_evals cannot be NULL");
    return ARK_ILL_INPUT;
  }

  /* get values from step_mem */
  *dom_eig_num_evals = step_mem->dom_eig_num_evals;

  return ARK_SUCCESS;
}